

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O1

void ranges(void)

{
  rtosc_arg_val_t *arg;
  rtosc_arg_val_t *rhs;
  rtosc_arg_val_t *prVar1;
  long lVar2;
  int iVar3;
  rtosc_arg_val_t r [8];
  rtosc_arg_val_t l [8];
  
  l[0].type = 'a';
  rtosc_av_arr_len_set(l,3);
  rtosc_av_arr_type_set(l,'i');
  prVar1 = l + 1;
  l[1].type = '-';
  iVar3 = 1;
  rtosc_av_rep_has_delta_set(prVar1,1);
  rtosc_av_rep_num_set(prVar1,5);
  l[2].type = 'i';
  l[2].val.i = 1;
  l[3].type = 'i';
  l[3].val.i = 1;
  r[0].type = 'a';
  rtosc_av_arr_len_set(r,5);
  rtosc_av_arr_type_set(r,'i');
  lVar2 = 0x20;
  do {
    *(undefined1 *)((long)r + lVar2 + -8) = 0x69;
    *(int *)(&r[0].type + lVar2) = iVar3;
    lVar2 = lVar2 + 0x18;
    iVar3 = iVar3 + 1;
  } while (lVar2 != 0x98);
  cmp_1(2,prVar1,r + 1,3,5,(rtosc_cmp_options *)0x0,"range 1 ... 5","integers 1 2 3 4 5",0x103);
  cmp_1(2,l,r,4,6,(rtosc_cmp_options *)0x0,"[1 ... 5]","[1 2 3 4 5]",0x106);
  l[4].val.i = 6;
  l[5].val.i = 7;
  l[5].type = 'i';
  l[4].type = 'i';
  arg = r + 4;
  r[4].type = '-';
  rtosc_av_rep_has_delta_set(arg,1);
  rtosc_av_rep_num_set(arg,4);
  r[5].type = 'i';
  r[5].val.i = 1;
  r[6].type = 'i';
  r[6].val.i = 4;
  rhs = r + 1;
  cmp_1(2,prVar1,rhs,5,6,(rtosc_cmp_options *)0x0,"1 ... 5 6 7","1 2 3 ... 7",0x116);
  rtosc_av_rep_num_set(arg,0);
  cmp_1(2,prVar1,rhs,5,6,(rtosc_cmp_options *)0x0,"1 ... 5 6 7","1 2 3 4 ...",0x11e);
  l[5].val.i = 6;
  cmp_gt(rhs,prVar1,6,5,(rtosc_cmp_options *)0x0,"infinite range","integers",0x124);
  rtosc_av_rep_num_set(prVar1,7);
  cmp_1(2,prVar1,rhs,3,7,(rtosc_cmp_options *)0x0,"finite range","infinite range",0x129);
  l[1].type = 'i';
  l[0].type = 'i';
  l[0].val.i = 1;
  l[1].val.i = 2;
  l[2].type = '-';
  rtosc_av_rep_has_delta_set(l + 2,1);
  rtosc_av_rep_num_set(l + 2,0);
  l[4].type = 'i';
  l[3].type = 'i';
  l[3].val.i = 3;
  l[4].val.i = 1;
  r[0].type = 'i';
  r[0].val.i = 1;
  r[1].type = '-';
  prVar1 = r + 1;
  rtosc_av_rep_has_delta_set(prVar1,1);
  rtosc_av_rep_num_set(prVar1,0);
  r[3].type = 'i';
  r[2].type = 'i';
  r[2].val.i = 1;
  r[3].val.i = 2;
  cmp_1(2,l,r,5,4,(rtosc_cmp_options *)0x0,"infinite range","infinite_range",0x13e);
  l[1].val.i = 1;
  l[2].type = 'i';
  l[2].val.i = 1;
  rtosc_av_rep_has_delta_set(prVar1,0);
  r[2].val.i = 1;
  cmp_1(2,l,r,3,3,(rtosc_cmp_options *)0x0,"numbers","infinite_range (no delta)",0x149);
  cmp_1(2,l,r,1,3,(rtosc_cmp_options *)0x0,"nothing","infinite_range (no delta)",0x14e);
  l[0].type = '-';
  rtosc_av_rep_num_set(l,0);
  rtosc_av_rep_has_delta_set(l,0);
  l[1].type = 'i';
  l[1].val.i = 1;
  cmp_1(2,l,r,2,3,(rtosc_cmp_options *)0x0,"infinite_range (no delta)","infinite_range (no delta)",
        0x158);
  r[0].type = '-';
  rtosc_av_rep_num_set(r,0);
  rtosc_av_rep_has_delta_set(r,0);
  r[1].type = 'i';
  r[1].val.i = 1;
  cmp_1(2,l,r,2,2,(rtosc_cmp_options *)0x0,"1 ...","1 ...",0x162);
  return;
}

Assistant:

void ranges()
{
    rtosc_arg_val_t l[8], r[8];

    // generate range 1 ... 5 inside of an array
    l[0].type = 'a';
    rtosc_av_arr_len_set(l, 3); // number of arg_val_t inside
    rtosc_av_arr_type_set(l, 'i');
    l[1].type = '-';
    rtosc_av_rep_has_delta_set(l+1, 1);
    rtosc_av_rep_num_set(l+1, 5);
    l[2].type = 'i';
    l[2].val.i = 1;
    l[3].type = 'i';
    l[3].val.i = 1;

    r[0].type = 'a';
    rtosc_av_arr_len_set(r, 5);
    rtosc_av_arr_type_set(r, 'i');
    for(size_t i = 0; i < 5; ++i) {
        r[i+1].type = 'i';
        r[i+1].val.i = i+1;
    }

    cmp_1(eq, l+1, r+1, 3, 5, NULL,
          "range 1 ... 5", "integers 1 2 3 4 5", __LINE__);

    cmp_1(eq, l, r, 4, 6, NULL,
          "[1 ... 5]", "[1 2 3 4 5]", __LINE__);

    // let l+1 = 1 ... 5 6 7
    // and r+1 = 1 2 3 4 ... 7
    l[4].val.i = 6;
    l[5].val.i = 7;
    l[4].type = l[5].type = 'i';
    r[4].type = '-';
    rtosc_av_rep_has_delta_set(r+4, 1);
    rtosc_av_rep_num_set(r+4, 4);
    r[5].type = 'i';
    r[5].val.i = 1;
    r[6].type = 'i';
    r[6].val.i = 4;

    cmp_1(eq, l+1, r+1, 5, 6, NULL,
          "1 ... 5 6 7", "1 2 3 ... 7", __LINE__);

    // keep    l+1 = 1 ... 5 6 7
    // and let r+1 = 1 2 3 4 ...
    rtosc_av_rep_num_set(r+4, 0);
    //r[6].type = 'x';

    cmp_1(eq, l+1, r+1, 5, 6, NULL,
          "1 ... 5 6 7", "1 2 3 4 ...", __LINE__);

    // let      l+1 = 1 ... 5 6 6
    // and keep r+1 = 1 2 3 4 ...
    l[5].val.i = 6;
    // careful! r and l are swapped!
    cmp_gt(r+1, l+1, 6, 5, NULL, "infinite range", "integers", __LINE__);

    // let      l+1 = 1 ... 7
    // and keep r+1 = 1 2 3 4 ...
    rtosc_av_rep_num_set(l+1, 7);
    cmp_1(eq, l+1, r+1, 3, 7, NULL, "finite range", "infinite range", __LINE__);

    // let l = 1 2 3 ...
    // and r = 1 2 ...
    l[0].type = l[1].type = 'i';
    l[0].val.i = 1; l[1].val.i = 2;
    l[2].type = '-';
    rtosc_av_rep_has_delta_set(l+2, 1);
    rtosc_av_rep_num_set(l+2, 0);
    l[3].type = l[4].type = 'i';
    l[3].val.i = 3; l[4].val.i = 1;

    r[0].type = 'i';
    r[0].val.i = 1;
    r[1].type = '-';
    rtosc_av_rep_has_delta_set(r+1, 1);
    rtosc_av_rep_num_set(r+1, 0);
    r[2].type = r[3].type = 'i';
    r[2].val.i = 1; r[3].val.i = 2;

    cmp_1(eq, l, r, 5, 4, NULL,
          "infinite range", "infinite_range", __LINE__);

    // let l = 1 1 1
    // and r = 1 1 ...
    l[1].val.i = 1;
    l[2].type = 'i';
    l[2].val.i = 1;
    rtosc_av_rep_has_delta_set(r+1, 0);
    r[2].val.i = 1;

    cmp_1(eq, l, r, 3, 3, NULL,
      "numbers", "infinite_range (no delta)", __LINE__);

    // let      l = 1
    // and keep r = 1 1 ...
    cmp_1(eq, l, r, 1, 3, NULL,
      "nothing", "infinite_range (no delta)", __LINE__);

    // let      l = 1 ...
    // and keep r = 1 1 ...
    l[0].type = '-';
    rtosc_av_rep_num_set(l, 0);
    rtosc_av_rep_has_delta_set(l, 0);
    l[1].type = 'i';
    l[1].val.i = 1;
    cmp_1(eq, l, r, 2, 3, NULL,
      "infinite_range (no delta)", "infinite_range (no delta)", __LINE__);


    // keep     l = 1 ...
    // and let  r = 1 ...
    r[0].type = '-';
    rtosc_av_rep_num_set(r, 0);
    rtosc_av_rep_has_delta_set(r, 0);
    r[1].type = 'i';
    r[1].val.i = 1;
    cmp_1(eq, l, r, 2, 2, NULL, "1 ...", "1 ...", __LINE__);
}